

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.cpp
# Opt level: O2

int ComputeDistanceCost(Command *cmds,size_t num_commands,BrotliDistanceParams *orig_params,
                       BrotliDistanceParams *new_params,double *cost,HistogramDistance *tmp)

{
  ulong uVar1;
  ushort uVar2;
  ulong uVar3;
  byte bVar4;
  size_t sVar5;
  uint16_t *puVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  
  sVar5 = 0;
  switchD_004a0b15::default(tmp,0,0x888);
  tmp->bit_cost_ = INFINITY;
  bVar11 = true;
  if (orig_params->distance_postfix_bits == new_params->distance_postfix_bits) {
    bVar11 = orig_params->num_direct_distance_codes != new_params->num_direct_distance_codes;
  }
  puVar6 = &cmds->dist_prefix_;
  dVar13 = 0.0;
  do {
    bVar10 = num_commands == 0;
    num_commands = num_commands - 1;
    if (bVar10) {
      dVar12 = duckdb_brotli::BrotliPopulationCostDistance(tmp);
      *cost = dVar13 + dVar12;
      return 1;
    }
    if (((*(uint *)(puVar6 + -5) & 0x1ffffff) != 0) && (0x7f < puVar6[-1])) {
      uVar2 = *puVar6;
      uVar3 = (ulong)uVar2;
      if (bVar11) {
        uVar9 = uVar2 & 0x3ff;
        uVar7 = orig_params->num_direct_distance_codes + 0x10;
        if (uVar7 <= uVar9) {
          bVar4 = (byte)orig_params->distance_postfix_bits;
          uVar9 = (uVar9 - orig_params->num_direct_distance_codes) - 0x10;
          uVar9 = uVar7 + (~(-1 << (bVar4 & 0x1f)) & uVar9) +
                  (*(uint32_t *)(puVar6 + -3) +
                   (((uVar9 >> (orig_params->distance_postfix_bits & 0x1f) & 1) != 0) + 2 <<
                   ((byte)(uVar2 >> 10) & 0x1f)) + -4 << (bVar4 & 0x1f));
        }
        uVar3 = (ulong)uVar9;
        if (new_params->max_distance < uVar3) {
          return 0;
        }
        uVar1 = (ulong)new_params->num_direct_distance_codes + 0x10;
        if (uVar1 <= uVar3) {
          bVar4 = (byte)new_params->distance_postfix_bits;
          uVar3 = ((uVar3 - new_params->num_direct_distance_codes) + (4L << (bVar4 & 0x3f))) - 0x10;
          uVar7 = 0x1f;
          uVar9 = (uint)uVar3;
          if (uVar9 != 0) {
            for (; uVar9 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          uVar7 = (uVar7 ^ 0xffffffe0) + 0x1f;
          iVar8 = uVar7 - new_params->distance_postfix_bits;
          uVar3 = (ulong)(((uint)((uVar3 >> ((ulong)uVar7 & 0x3f) & 1) != 0) + iVar8 * 2 + 0xfffe <<
                          (bVar4 & 0x3f)) + (int)uVar1 + (~(-1 << (bVar4 & 0x1f)) & uVar9) |
                         iVar8 * 0x400);
        }
      }
      tmp->data_[(uint)uVar3 & 0x3ff] = tmp->data_[(uint)uVar3 & 0x3ff] + 1;
      sVar5 = sVar5 + 1;
      tmp->total_count_ = sVar5;
      dVar13 = dVar13 + (double)(int)((uVar3 & 0xffff) >> 10);
    }
    puVar6 = puVar6 + 8;
  } while( true );
}

Assistant:

static BROTLI_BOOL ComputeDistanceCost(const Command* cmds,
                                       size_t num_commands,
                                       const BrotliDistanceParams* orig_params,
                                       const BrotliDistanceParams* new_params,
                                       double* cost,
                                       HistogramDistance* tmp) {
  size_t i;
  BROTLI_BOOL equal_params = BROTLI_FALSE;
  uint16_t dist_prefix;
  uint32_t dist_extra;
  double extra_bits = 0.0;
  HistogramClearDistance(tmp);

  if (orig_params->distance_postfix_bits == new_params->distance_postfix_bits &&
      orig_params->num_direct_distance_codes ==
      new_params->num_direct_distance_codes) {
    equal_params = BROTLI_TRUE;
  }

  for (i = 0; i < num_commands; i++) {
    const Command* cmd = &cmds[i];
    if (CommandCopyLen(cmd) && cmd->cmd_prefix_ >= 128) {
      if (equal_params) {
        dist_prefix = cmd->dist_prefix_;
      } else {
        uint32_t distance = CommandRestoreDistanceCode(cmd, orig_params);
        if (distance > new_params->max_distance) {
          return BROTLI_FALSE;
        }
        PrefixEncodeCopyDistance(distance,
                                 new_params->num_direct_distance_codes,
                                 new_params->distance_postfix_bits,
                                 &dist_prefix,
                                 &dist_extra);
      }
      HistogramAddDistance(tmp, dist_prefix & 0x3FF);
      extra_bits += dist_prefix >> 10;
    }
  }

  *cost = BrotliPopulationCostDistance(tmp) + extra_bits;
  return BROTLI_TRUE;
}